

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O0

void TestCipherAPI(EVP_CIPHER *cipher,Operation op,bool padding,bool copy,bool in_place,
                  bool use_evp_cipher,size_t chunk_size,Span<const_unsigned_char> key,
                  Span<const_unsigned_char> iv,Span<const_unsigned_char> plaintext,
                  Span<const_unsigned_char> ciphertext,Span<const_unsigned_char> aad,
                  Span<const_unsigned_char> tag)

{
  Span<const_unsigned_char> span;
  Span<unsigned_char> SVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  EVP_CIPHER_CTX *pEVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  uchar *puVar11;
  pointer ctx_00;
  iterator __first;
  iterator __last;
  unsigned_long *puVar12;
  uchar *puVar13;
  uchar *puVar14;
  size_t sVar15;
  bool bVar16;
  Span<const_unsigned_char> SVar17;
  size_t local_ae8;
  size_t local_a30;
  Span<const_unsigned_char> *local_968;
  Span<const_unsigned_char> *local_960;
  AssertHelper local_918;
  Message local_910;
  Bytes local_908;
  uchar *local_8f8;
  size_t sStack_8f0;
  Bytes local_8e8;
  undefined1 local_8d8 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_8a8;
  Message local_8a0;
  int local_894;
  undefined1 local_890 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_860;
  Message local_858;
  bool local_849;
  undefined1 local_848 [8];
  AssertionResult gtest_ar__17;
  Message local_830;
  unsigned_long local_828;
  size_t local_820;
  undefined1 local_818 [8];
  AssertionResult gtest_ar_11;
  uint8_t rtag [16];
  Message local_7f0;
  Span<const_unsigned_char> local_7e8;
  Bytes local_7d8;
  uchar *local_7c8;
  size_t sStack_7c0;
  Bytes local_7b0;
  undefined1 local_7a0 [8];
  AssertionResult gtest_ar_10;
  Message local_788;
  int local_77c;
  undefined1 local_778 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_748;
  Message local_740;
  int local_734;
  undefined1 local_730 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_700;
  Message local_6f8;
  bool local_6e9;
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar__15;
  Message local_6d0;
  int local_6c8;
  int local_6c4;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_690;
  Message local_688;
  undefined1 local_680 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_660;
  Message local_658;
  int local_64c;
  undefined1 local_648 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_618;
  Message local_610;
  int local_604;
  undefined1 local_600 [8];
  AssertionResult gtest_ar__13;
  Message local_5e8;
  int local_5e0;
  int local_5dc;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_5a8;
  Message local_5a0;
  bool local_591;
  undefined1 local_590 [8];
  AssertionResult gtest_ar__12;
  Message local_578;
  unsigned_long local_570;
  undefined1 local_568 [8];
  AssertionResult gtest_ar_5;
  size_t local_550;
  size_t todo_1;
  size_type sStack_540;
  int len;
  size_t total;
  Span<unsigned_char> local_528;
  uchar *local_518;
  uchar *local_510;
  uchar *local_508;
  uchar *local_500;
  allocator<unsigned_char> local_4f1;
  undefined1 local_4f0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  size_t block_size;
  size_t max_out;
  AssertHelper local_4b8;
  Message local_4b0;
  uint local_4a4;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_470;
  Message local_468;
  int local_45c;
  undefined1 local_458 [8];
  AssertionResult gtest_ar__11;
  int len_1;
  Message local_438;
  int local_430;
  uint local_42c;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_3f8;
  Message local_3f0;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar__10;
  uint local_3d0;
  size_t todo;
  AssertHelper local_3a8;
  Message local_3a0;
  int local_394;
  undefined1 local_390 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_360;
  Message local_358;
  int local_34c;
  undefined1 local_348 [8];
  AssertionResult gtest_ar__8;
  Message local_330;
  uint local_324;
  size_t local_320;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_2;
  Message local_300;
  size_t local_2f8;
  uint local_2ec;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_2b8;
  Message local_2b0;
  int local_2a4;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar__7;
  Message local_288;
  unsigned_long local_280;
  size_t local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar;
  AssertHelper local_240;
  Message local_238;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1f8;
  Message local_1f0;
  int local_1e4;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1b0;
  Message local_1a8;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_168;
  Message local_160;
  int local_154;
  undefined1 local_150 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_120;
  Message local_118;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_d8;
  Message local_d0;
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__1;
  string local_a8;
  AssertHelper local_88;
  Message local_80 [3];
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  UniquePtr<EVP_CIPHER_CTX> ctx;
  bool is_aead;
  Span<const_unsigned_char> expected;
  undefined1 local_30 [8];
  Span<const_unsigned_char> in;
  bool is_custom_cipher;
  bool encrypt;
  bool use_evp_cipher_local;
  bool in_place_local;
  bool copy_local;
  bool padding_local;
  Operation op_local;
  EVP_CIPHER *cipher_local;
  
  local_968 = &plaintext;
  in.size_._7_1_ = op == kEncrypt;
  pcVar8 = (char *)chunk_size;
  uVar6 = EVP_CIPHER_flags((EVP_CIPHER *)cipher);
  in.size_._6_1_ = (uVar6 & 0x400) != 0;
  local_960 = &ciphertext;
  if ((in.size_._7_1_ & 1) != 0) {
    local_960 = local_968;
  }
  local_30 = (undefined1  [8])local_960->data_;
  in.data_ = (uchar *)local_960->size_;
  if ((in.size_._7_1_ & 1) != 0) {
    local_968 = &ciphertext;
  }
  puVar14 = local_968->data_;
  sVar15 = local_968->size_;
  span = *local_968;
  uVar3 = EVP_CIPHER_mode(cipher);
  bVar16 = uVar3 == 6;
  pEVar7 = EVP_CIPHER_CTX_new();
  std::unique_ptr<evp_cipher_ctx_st,bssl::internal::Deleter>::
  unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<evp_cipher_ctx_st,bssl::internal::Deleter> *)&gtest_ar_.message_,
             (pointer)pEVar7);
  testing::AssertionResult::
  AssertionResult<std::unique_ptr<evp_cipher_ctx_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_68,
             (unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,
             (type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(internal *)local_68,(AssertionResult *)0x82c8ac,"false","true",pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x98,pcVar8);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    testing::Message::~Message(local_80);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  SVar1.size_ = local_528.size_;
  SVar1.data_ = local_528.data_;
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ != 0) goto LAB_002e9879;
  pEVar7 = (EVP_CIPHER_CTX *)
           std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                     ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
  ;
  pcVar8 = (char *)(ulong)(in.size_._7_1_ & 1);
  local_c4 = EVP_CipherInit_ex(pEVar7,(EVP_CIPHER *)cipher,(ENGINE *)0x0,(uchar *)0x0,(uchar *)0x0,
                               in.size_._7_1_ & 1);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_c0,&local_c4,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar2) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_c0,
               (AssertionResult *)
               "EVP_CipherInit_ex(ctx.get(), cipher, nullptr, nullptr, nullptr, encrypt ? 1 : 0)",
               "false","true",pcVar8);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x9b,pcVar9);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_d0);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  SVar1.size_ = local_528.size_;
  SVar1.data_ = local_528.data_;
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ != 0) goto LAB_002e9879;
  pEVar7 = (EVP_CIPHER_CTX *)
           std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                     ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
  ;
  sVar10 = bssl::Span<const_unsigned_char>::size(&key);
  local_10c = EVP_CIPHER_CTX_set_key_length(pEVar7,(int)sVar10);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)local_108,&local_10c,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar2) {
    testing::Message::Message(&local_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_108,
               (AssertionResult *)"EVP_CIPHER_CTX_set_key_length(ctx.get(), key.size())","false",
               "true",pcVar8);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0x9c,pcVar9);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_118);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  SVar1.size_ = local_528.size_;
  SVar1.data_ = local_528.data_;
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ != 0) goto LAB_002e9879;
  if (!padding) {
    pEVar7 = (EVP_CIPHER_CTX *)
             std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                        &gtest_ar_.message_);
    local_154 = EVP_CIPHER_CTX_set_padding(pEVar7,0);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_150,&local_154,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
    if (!bVar2) {
      testing::Message::Message(&local_160);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__4.message_,(internal *)local_150,
                 (AssertionResult *)"EVP_CIPHER_CTX_set_padding(ctx.get(), 0)","false","true",pcVar8
                );
      pcVar9 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x9e,pcVar9);
      testing::internal::AssertHelper::operator=(&local_168,&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
      testing::Message::~Message(&local_160);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
    SVar1.size_ = local_528.size_;
    SVar1.data_ = local_528.data_;
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) goto LAB_002e9879;
  }
  local_199 = MaybeCopyCipherContext(copy,(UniquePtr<EVP_CIPHER_CTX> *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_198,&local_199,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar2) {
    testing::Message::Message(&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_198,
               (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false","true",pcVar8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0xa2,pcVar8);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_1a8);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  SVar1.size_ = local_528.size_;
  SVar1.data_ = local_528.data_;
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ != 0) goto LAB_002e9879;
  pEVar7 = (EVP_CIPHER_CTX *)
           std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                     ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
  ;
  puVar11 = bssl::Span<const_unsigned_char>::data(&key);
  pcVar8 = (char *)0xffffffff;
  local_1e4 = EVP_CipherInit_ex(pEVar7,(EVP_CIPHER *)0x0,(ENGINE *)0x0,puVar11,(uchar *)0x0,-1);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)local_1e0,&local_1e4,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar2) {
    testing::Message::Message(&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_1e0,
               (AssertionResult *)
               "EVP_CipherInit_ex(ctx.get(), nullptr, nullptr, key.data(), nullptr, -1)","false",
               "true",pcVar8);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0xa5,pcVar9);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_1f0);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  SVar1.size_ = local_528.size_;
  SVar1.data_ = local_528.data_;
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ != 0) goto LAB_002e9879;
  local_229 = MaybeCopyCipherContext(copy,(UniquePtr<EVP_CIPHER_CTX> *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_228,&local_229,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar2) {
    testing::Message::Message(&local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_228,
               (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false","true",pcVar8);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0xab,pcVar9);
    testing::internal::AssertHelper::operator=(&local_240,&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_238);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  SVar1.size_ = local_528.size_;
  SVar1.data_ = local_528.data_;
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ != 0) goto LAB_002e9879;
  if (bVar16) {
    local_278 = bssl::Span<const_unsigned_char>::size(&iv);
    local_280 = 0x7fffffff;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((internal *)local_270,"iv.size()","size_t{2147483647}",&local_278,&local_280);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
    if (!bVar2) {
      testing::Message::Message(&local_288);
      pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__7.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xad,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7.message_,&local_288);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7.message_);
      testing::Message::~Message(&local_288);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
    SVar1.size_ = local_528.size_;
    SVar1.data_ = local_528.data_;
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) goto LAB_002e9879;
    pEVar7 = (EVP_CIPHER_CTX *)
             std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                        &gtest_ar_.message_);
    sVar10 = bssl::Span<const_unsigned_char>::size(&iv);
    local_2a4 = EVP_CIPHER_CTX_ctrl(pEVar7,9,(int)sVar10,(void *)0x0);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_2a0,&local_2a4,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
    if (!bVar2) {
      testing::Message::Message(&local_2b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_2a0,
                 (AssertionResult *)
                 "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x9, static_cast<int>(iv.size()), nullptr)","false"
                 ,"true",pcVar8);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xaf,pcVar8);
      testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
      testing::internal::AssertHelper::~AssertHelper(&local_2b8);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_2b0);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
    SVar1.size_ = local_528.size_;
    SVar1.data_ = local_528.data_;
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) goto LAB_002e9879;
    pEVar7 = (EVP_CIPHER_CTX *)
             std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                        &gtest_ar_.message_);
    local_2ec = EVP_CIPHER_CTX_iv_length(pEVar7);
    local_2f8 = bssl::Span<const_unsigned_char>::size(&iv);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_2e8,"EVP_CIPHER_CTX_iv_length(ctx.get())","iv.size()",&local_2ec,
               &local_2f8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
    if (!bVar2) {
      testing::Message::Message(&local_300);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xb0,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_300);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_300);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
    SVar1.size_ = local_528.size_;
    SVar1.data_ = local_528.data_;
  }
  else {
    local_320 = bssl::Span<const_unsigned_char>::size(&iv);
    pEVar7 = (EVP_CIPHER_CTX *)
             std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                        &gtest_ar_.message_);
    local_324 = EVP_CIPHER_CTX_iv_length(pEVar7);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_318,"iv.size()","EVP_CIPHER_CTX_iv_length(ctx.get())",&local_320,
               &local_324);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
    if (!bVar2) {
      testing::Message::Message(&local_330);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__8.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xb2,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__8.message_,&local_330);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8.message_);
      testing::Message::~Message(&local_330);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
    SVar1.size_ = local_528.size_;
    SVar1.data_ = local_528.data_;
  }
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ != 0) goto LAB_002e9879;
  pEVar7 = (EVP_CIPHER_CTX *)
           std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                     ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
  ;
  puVar11 = bssl::Span<const_unsigned_char>::data(&iv);
  pcVar8 = (char *)0xffffffff;
  local_34c = EVP_CipherInit_ex(pEVar7,(EVP_CIPHER *)0x0,(ENGINE *)0x0,(uchar *)0x0,puVar11,-1);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)local_348,&local_34c,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar2) {
    testing::Message::Message(&local_358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_348,
               (AssertionResult *)
               "EVP_CipherInit_ex(ctx.get(), nullptr, nullptr, nullptr, iv.data(), -1)","false",
               "true",pcVar8);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
               ,0xb6,pcVar9);
    testing::internal::AssertHelper::operator=(&local_360,&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_358);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  SVar1.size_ = local_528.size_;
  SVar1.data_ = local_528.data_;
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ != 0) goto LAB_002e9879;
  if ((bVar16) && ((in.size_._7_1_ & 1) == 0)) {
    pEVar7 = (EVP_CIPHER_CTX *)
             std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                        &gtest_ar_.message_);
    sVar10 = bssl::Span<const_unsigned_char>::size(&tag);
    puVar11 = bssl::Span<const_unsigned_char>::data(&tag);
    local_394 = EVP_CIPHER_CTX_ctrl(pEVar7,0x11,(int)sVar10,puVar11);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_390,&local_394,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
    if (!bVar2) {
      testing::Message::Message(&local_3a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&todo,(internal *)local_390,
                 (AssertionResult *)
                 "EVP_CIPHER_CTX_ctrl(ctx.get(), 0x11, tag.size(), const_cast<uint8_t *>(tag.data()))"
                 ,"false","true",pcVar8);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xbb,pcVar9);
      testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
      testing::internal::AssertHelper::~AssertHelper(&local_3a8);
      std::__cxx11::string::~string((string *)&todo);
      testing::Message::~Message(&local_3a0);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
    SVar1.size_ = local_528.size_;
    SVar1.data_ = local_528.data_;
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) goto LAB_002e9879;
  }
  while (bVar2 = bssl::Span<const_unsigned_char>::empty(&aad), ((bVar2 ^ 0xffU) & 1) != 0) {
    if (chunk_size == 0) {
      local_a30 = bssl::Span<const_unsigned_char>::size(&aad);
    }
    else {
      gtest_ar__10.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )bssl::Span<const_unsigned_char>::size(&aad);
      puVar12 = std::min<unsigned_long>((unsigned_long *)&gtest_ar__10.message_,&chunk_size);
      local_a30 = *puVar12;
    }
    local_3d0 = (uint)local_a30;
    if (use_evp_cipher) {
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_3e8,(bool *)((long)&in.size_ + 6),(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
      if (!bVar2) {
        testing::Message::Message(&local_3f0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_3.message_,(internal *)local_3e8,
                   (AssertionResult *)"is_custom_cipher","false","true",pcVar8);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_3f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,199,pcVar9);
        testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
        testing::internal::AssertHelper::~AssertHelper(&local_3f8);
        std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_3f0);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
      SVar1.size_ = local_528.size_;
      SVar1.data_ = local_528.data_;
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_002e9879;
      local_42c = local_3d0;
      pEVar7 = (EVP_CIPHER_CTX *)
               std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                          &gtest_ar_.message_);
      puVar11 = bssl::Span<const_unsigned_char>::data(&aad);
      local_430 = EVP_Cipher(pEVar7,(uchar *)0x0,puVar11,local_3d0);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_428,"static_cast<int>(todo)",
                 "EVP_Cipher(ctx.get(), nullptr, aad.data(), todo)",(int *)&local_42c,&local_430);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
      if (!bVar2) {
        testing::Message::Message(&local_438);
        pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffbc0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0xc9,pcVar9);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffbc0,&local_438);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc0);
        testing::Message::~Message(&local_438);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
      SVar1.size_ = local_528.size_;
      SVar1.data_ = local_528.data_;
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_002e9879;
    }
    else {
      pEVar7 = (EVP_CIPHER_CTX *)
               std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                          &gtest_ar_.message_);
      puVar11 = bssl::Span<const_unsigned_char>::data(&aad);
      local_45c = EVP_CipherUpdate(pEVar7,(uchar *)0x0,
                                   (int *)((long)&gtest_ar__11.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl + 4),puVar11,local_3d0);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_458,&local_45c,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
      if (!bVar2) {
        testing::Message::Message(&local_468);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_4.message_,(internal *)local_458,
                   (AssertionResult *)"EVP_CipherUpdate(ctx.get(), nullptr, &len, aad.data(), todo)"
                   ,"false","true",pcVar8);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_470,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0xcc,pcVar9);
        testing::internal::AssertHelper::operator=(&local_470,&local_468);
        testing::internal::AssertHelper::~AssertHelper(&local_470);
        std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_468);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
      SVar1.size_ = local_528.size_;
      SVar1.data_ = local_528.data_;
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_002e9879;
      local_4a4 = local_3d0;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_4a0,"len","static_cast<int>(todo)",
                 (int *)((long)&gtest_ar__11.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 4),(int *)&local_4a4);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
      if (!bVar2) {
        testing::Message::Message(&local_4b0);
        pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0xcf,pcVar9);
        testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
        testing::internal::AssertHelper::~AssertHelper(&local_4b8);
        testing::Message::~Message(&local_4b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
    }
    aad = bssl::Span<const_unsigned_char>::subspan(&aad,local_a30,0xffffffffffffffff);
  }
  block_size = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_30);
  pEVar7 = (EVP_CIPHER_CTX *)
           std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                     ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_)
  ;
  uVar4 = EVP_CIPHER_CTX_block_size(pEVar7);
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)uVar4;
  if ((pointer)0x1 <
      result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    pEVar7 = (EVP_CIPHER_CTX *)
             std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                        &gtest_ar_.message_);
    uVar6 = EVP_CIPHER_CTX_flags(pEVar7);
    if ((uVar6 & 0x800) == 0) {
      ctx_00 = std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                          &gtest_ar_.message_);
      iVar5 = EVP_CIPHER_CTX_encrypting(ctx_00);
      if (iVar5 != 0) {
        block_size = (size_t)(result.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage +
                             (block_size -
                             block_size %
                             (ulong)result.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage));
      }
    }
  }
  std::allocator<unsigned_char>::allocator(&local_4f1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4f0,block_size,
             &local_4f1);
  std::allocator<unsigned_char>::~allocator(&local_4f1);
  if (in_place) {
    __first = bssl::Span<const_unsigned_char>::begin((Span<const_unsigned_char> *)local_30);
    __last = bssl::Span<const_unsigned_char>::end((Span<const_unsigned_char> *)local_30);
    local_500 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_4f0);
    local_508 = (uchar *)std::
                         copy<unsigned_char_const*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                   (__first,__last,
                                    (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     )local_500);
    bssl::Span<unsigned_char>::
    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<unsigned_char> *)&total,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4f0);
    sVar10 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_30);
    local_528 = bssl::Span<unsigned_char>::first((Span<unsigned_char> *)&total,sVar10);
    bssl::Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_518,&local_528);
    local_30 = (undefined1  [8])local_518;
    in.data_ = local_510;
  }
  SVar17.size_ = (size_t)in.data_;
  SVar17.data_ = (uchar *)gtest_ar__14.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
  sStack_540 = 0;
  while( true ) {
    in.data_ = (uchar *)SVar17.size_;
    gtest_ar__14.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )SVar17.data_;
    bVar2 = bssl::Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)local_30);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    if (chunk_size == 0) {
      local_ae8 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_30);
    }
    else {
      gtest_ar_5.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_30);
      puVar12 = std::min<unsigned_long>((unsigned_long *)&gtest_ar_5.message_,&chunk_size);
      local_ae8 = *puVar12;
    }
    local_550 = local_ae8;
    local_570 = 0x7fffffff;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              ((internal *)local_568,"todo","static_cast<size_t>(2147483647)",&local_550,&local_570)
    ;
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
    if (!bVar2) {
      testing::Message::Message(&local_578);
      pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_568);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__12.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xe6,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__12.message_,&local_578);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__12.message_);
      testing::Message::~Message(&local_578);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
    local_591 = MaybeCopyCipherContext(copy,(UniquePtr<EVP_CIPHER_CTX> *)&gtest_ar_.message_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_590,&local_591,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
    if (!bVar2) {
      testing::Message::Message(&local_5a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_6.message_,(internal *)local_590,
                 (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false","true",pcVar8);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_5a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xe7,pcVar9);
      testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
      testing::internal::AssertHelper::~AssertHelper(&local_5a8);
      std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_5a0);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) goto LAB_002e986d;
    if (use_evp_cipher) {
      if ((in.size_._6_1_ & 1) == 0) {
        local_5dc = 1;
        pEVar7 = (EVP_CIPHER_CTX *)
                 std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                            &gtest_ar_.message_);
        puVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4f0);
        puVar11 = puVar11 + sStack_540;
        puVar13 = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_30);
        local_5e0 = EVP_Cipher(pEVar7,puVar11,puVar13,(uint)local_550);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_5d8,"1",
                   "EVP_Cipher(ctx.get(), result.data() + total, in.data(), todo)",&local_5dc,
                   &local_5e0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
        if (!bVar2) {
          testing::Message::Message(&local_5e8);
          pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_5d8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__13.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0xef,pcVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__13.message_,&local_5e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__13.message_);
          testing::Message::~Message(&local_5e8);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ != 0) goto LAB_002e986d;
        todo_1._4_4_ = (int)local_550;
      }
      else {
        pEVar7 = (EVP_CIPHER_CTX *)
                 std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                            &gtest_ar_.message_);
        puVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4f0);
        puVar11 = puVar11 + sStack_540;
        puVar13 = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_30);
        todo_1._4_4_ = EVP_Cipher(pEVar7,puVar11,puVar13,(uint)local_550);
      }
    }
    else {
      pEVar7 = (EVP_CIPHER_CTX *)
               std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                          &gtest_ar_.message_);
      puVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4f0);
      puVar11 = puVar11 + sStack_540;
      puVar13 = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_30);
      local_604 = EVP_CipherUpdate(pEVar7,puVar11,(int *)((long)&todo_1 + 4),puVar13,(int)local_550)
      ;
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_600,&local_604,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
      if (!bVar2) {
        testing::Message::Message(&local_610);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_7.message_,(internal *)local_600,
                   (AssertionResult *)
                   "EVP_CipherUpdate(ctx.get(), result.data() + total, &len, in.data(), static_cast<int>(todo))"
                   ,"false","true",pcVar8);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_618,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0xf4,pcVar9);
        testing::internal::AssertHelper::operator=(&local_618,&local_610);
        testing::internal::AssertHelper::~AssertHelper(&local_618);
        std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_610);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_002e986d;
    }
    local_64c = 0;
    testing::internal::CmpHelperGE<int,int>
              ((internal *)local_648,"len","0",(int *)((long)&todo_1 + 4),&local_64c);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_648);
    if (!bVar2) {
      testing::Message::Message(&local_658);
      pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_648);
      testing::internal::AssertHelper::AssertHelper
                (&local_660,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0xf6,pcVar9);
      testing::internal::AssertHelper::operator=(&local_660,&local_658);
      testing::internal::AssertHelper::~AssertHelper(&local_660);
      testing::Message::~Message(&local_658);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_648);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) goto LAB_002e986d;
    sStack_540 = sStack_540 + (long)todo_1._4_4_;
    SVar17 = bssl::Span<const_unsigned_char>::subspan
                       ((Span<const_unsigned_char> *)local_30,local_550,0xffffffffffffffff);
    local_30 = (undefined1  [8])SVar17.data_;
  }
  if (op == kInvalidDecrypt) {
    if (use_evp_cipher) {
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_680,(bool *)((long)&in.size_ + 6),(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
      if (!bVar2) {
        testing::Message::Message(&local_688);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_8.message_,(internal *)local_680,
                   (AssertionResult *)"is_custom_cipher","false","true",pcVar8);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_690,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0xfe,pcVar8);
        testing::internal::AssertHelper::operator=(&local_690,&local_688);
        testing::internal::AssertHelper::~AssertHelper(&local_690);
        std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
        testing::Message::~Message(&local_688);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_002e986d;
      local_6c4 = -1;
      pEVar7 = (EVP_CIPHER_CTX *)
               std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                          &gtest_ar_.message_);
      local_6c8 = EVP_Cipher(pEVar7,(uchar *)0x0,(uchar *)0x0,0);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_6c0,"-1","EVP_Cipher(ctx.get(), nullptr, nullptr, 0)",&local_6c4,
                 &local_6c8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
      if (!bVar2) {
        testing::Message::Message(&local_6d0);
        pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_6c0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__15.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0xff,pcVar8);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__15.message_,&local_6d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__15.message_);
        testing::Message::~Message(&local_6d0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
    }
    else {
      pEVar7 = (EVP_CIPHER_CTX *)
               std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                          &gtest_ar_.message_);
      puVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4f0);
      iVar5 = EVP_CipherFinal_ex(pEVar7,puVar14 + sStack_540,(int *)((long)&todo_1 + 4));
      local_6e9 = iVar5 == 0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_6e8,&local_6e9,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e8);
      if (!bVar2) {
        testing::Message::Message(&local_6f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__16.message_,(internal *)local_6e8,
                   (AssertionResult *)"EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len)",
                   "true","false",pcVar8);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_700,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x103,pcVar8);
        testing::internal::AssertHelper::operator=(&local_700,&local_6f8);
        testing::internal::AssertHelper::~AssertHelper(&local_700);
        std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
        testing::Message::~Message(&local_6f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e8);
    }
LAB_002e9863:
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  else {
    if (use_evp_cipher) {
      if ((in.size_._6_1_ & 1) == 0) {
        todo_1._4_4_ = 0;
      }
      else {
        pEVar7 = (EVP_CIPHER_CTX *)
                 std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                            &gtest_ar_.message_);
        todo_1._4_4_ = EVP_Cipher(pEVar7,(uchar *)0x0,(uchar *)0x0,0);
      }
    }
    else {
      pEVar7 = (EVP_CIPHER_CTX *)
               std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                          &gtest_ar_.message_);
      puVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4f0);
      local_734 = EVP_CipherFinal_ex(pEVar7,puVar11 + sStack_540,(int *)((long)&todo_1 + 4));
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_730,&local_734,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
      if (!bVar2) {
        testing::Message::Message(&local_740);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_9.message_,(internal *)local_730,
                   (AssertionResult *)"EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len)",
                   "false","true",pcVar8);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_748,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x10f,pcVar9);
        testing::internal::AssertHelper::operator=(&local_748,&local_740);
        testing::internal::AssertHelper::~AssertHelper(&local_748);
        std::__cxx11::string::~string((string *)&gtest_ar_9.message_);
        testing::Message::~Message(&local_740);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ != 0) goto LAB_002e986d;
    }
    local_77c = 0;
    testing::internal::CmpHelperGE<int,int>
              ((internal *)local_778,"len","0",(int *)((long)&todo_1 + 4),&local_77c);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
    if (!bVar2) {
      testing::Message::Message(&local_788);
      pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_778);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                 ,0x111,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_788);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_788);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      sStack_540 = sStack_540 + (long)todo_1._4_4_;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4f0,sStack_540);
      local_7c8 = puVar14;
      sStack_7c0 = sVar15;
      Bytes::Bytes(&local_7b0,span);
      bssl::Span<unsigned_char_const>::
      Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<unsigned_char_const> *)&local_7e8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4f0);
      Bytes::Bytes(&local_7d8,local_7e8);
      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                ((EqHelper *)local_7a0,"Bytes(expected)","Bytes(result)",&local_7b0,&local_7d8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a0);
      if (!bVar2) {
        testing::Message::Message(&local_7f0);
        pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_7a0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)(rtag + 8),kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x114,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)(rtag + 8),&local_7f0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(rtag + 8));
        testing::Message::~Message(&local_7f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a0);
      if (((in.size_._7_1_ & 1) == 0) || (!bVar16)) goto LAB_002e9863;
      local_820 = bssl::Span<const_unsigned_char>::size(&tag);
      local_828 = 0x10;
      testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                ((internal *)local_818,"tag.size()","sizeof(rtag)",&local_820,&local_828);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
      if (!bVar2) {
        testing::Message::Message(&local_830);
        pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_818);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__17.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                   ,0x117,pcVar9);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__17.message_,&local_830);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__17.message_);
        testing::Message::~Message(&local_830);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_849 = MaybeCopyCipherContext(copy,(UniquePtr<EVP_CIPHER_CTX> *)&gtest_ar_.message_);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_848,&local_849,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_848);
        if (!bVar2) {
          testing::Message::Message(&local_858);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__18.message_,(internal *)local_848,
                     (AssertionResult *)"MaybeCopyCipherContext(copy, &ctx)","false","true",pcVar8);
          pcVar9 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_860,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                     ,0x118,pcVar9);
          testing::internal::AssertHelper::operator=(&local_860,&local_858);
          testing::internal::AssertHelper::~AssertHelper(&local_860);
          std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
          testing::Message::~Message(&local_858);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_848);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pEVar7 = (EVP_CIPHER_CTX *)
                   std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          sVar15 = bssl::Span<const_unsigned_char>::size(&tag);
          local_894 = EVP_CIPHER_CTX_ctrl(pEVar7,0x10,(int)sVar15,&gtest_ar_11.message_);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_890,&local_894,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_890);
          if (!bVar2) {
            testing::Message::Message(&local_8a0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_12.message_,(internal *)local_890,
                       (AssertionResult *)"EVP_CIPHER_CTX_ctrl(ctx.get(), 0x10, tag.size(), rtag)",
                       "false","true",pcVar8);
            pcVar8 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_8a8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                       ,0x11a,pcVar8);
            testing::internal::AssertHelper::operator=(&local_8a8,&local_8a0);
            testing::internal::AssertHelper::~AssertHelper(&local_8a8);
            std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
            testing::Message::~Message(&local_8a0);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_890);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_8f8 = tag.data_;
            sStack_8f0 = tag.size_;
            Bytes::Bytes(&local_8e8,tag);
            sVar15 = bssl::Span<const_unsigned_char>::size(&tag);
            Bytes::Bytes(&local_908,(uint8_t *)&gtest_ar_11.message_,sVar15);
            testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                      ((EqHelper *)local_8d8,"Bytes(tag)","Bytes(rtag, tag.size())",&local_8e8,
                       &local_908);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d8);
            if (!bVar2) {
              testing::Message::Message(&local_910);
              pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)local_8d8);
              testing::internal::AssertHelper::AssertHelper
                        (&local_918,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/cipher_test.cc"
                         ,0x11b,pcVar8);
              testing::internal::AssertHelper::operator=(&local_918,&local_910);
              testing::internal::AssertHelper::~AssertHelper(&local_918);
              testing::Message::~Message(&local_910);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d8);
            goto LAB_002e9863;
          }
        }
      }
    }
  }
LAB_002e986d:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4f0);
  SVar1 = local_528;
LAB_002e9879:
  local_528 = SVar1;
  std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

static void TestCipherAPI(const EVP_CIPHER *cipher, Operation op, bool padding,
                          bool copy, bool in_place, bool use_evp_cipher,
                          size_t chunk_size, bssl::Span<const uint8_t> key,
                          bssl::Span<const uint8_t> iv,
                          bssl::Span<const uint8_t> plaintext,
                          bssl::Span<const uint8_t> ciphertext,
                          bssl::Span<const uint8_t> aad,
                          bssl::Span<const uint8_t> tag) {
  bool encrypt = op == Operation::kEncrypt;
  bool is_custom_cipher =
      EVP_CIPHER_flags(cipher) & EVP_CIPH_FLAG_CUSTOM_CIPHER;
  bssl::Span<const uint8_t> in = encrypt ? plaintext : ciphertext;
  bssl::Span<const uint8_t> expected = encrypt ? ciphertext : plaintext;
  bool is_aead = EVP_CIPHER_mode(cipher) == EVP_CIPH_GCM_MODE;

  // Some |EVP_CIPHER|s take a variable-length key, and need to first be
  // configured with the key length, which requires configuring the cipher.
  bssl::UniquePtr<EVP_CIPHER_CTX> ctx(EVP_CIPHER_CTX_new());
  ASSERT_TRUE(ctx);
  ASSERT_TRUE(EVP_CipherInit_ex(ctx.get(), cipher, /*engine=*/nullptr,
                                /*key=*/nullptr, /*iv=*/nullptr,
                                encrypt ? 1 : 0));
  ASSERT_TRUE(EVP_CIPHER_CTX_set_key_length(ctx.get(), key.size()));
  if (!padding) {
    ASSERT_TRUE(EVP_CIPHER_CTX_set_padding(ctx.get(), 0));
  }

  // Configure the key.
  ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
  ASSERT_TRUE(EVP_CipherInit_ex(ctx.get(), /*cipher=*/nullptr,
                                /*engine=*/nullptr, key.data(), /*iv=*/nullptr,
                                /*enc=*/-1));

  // Configure the IV to run the actual operation. Callers that wish to use a
  // key for multiple, potentially concurrent, operations will likely copy at
  // this point. The |EVP_CIPHER_CTX| API uses the same type to represent a
  // pre-computed key schedule and a streaming operation.
  ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
  if (is_aead) {
    ASSERT_LE(iv.size(), size_t{INT_MAX});
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_IVLEN,
                                    static_cast<int>(iv.size()), nullptr));
    ASSERT_EQ(EVP_CIPHER_CTX_iv_length(ctx.get()), iv.size());
  } else {
    ASSERT_EQ(iv.size(), EVP_CIPHER_CTX_iv_length(ctx.get()));
  }
  ASSERT_TRUE(EVP_CipherInit_ex(ctx.get(), /*cipher=*/nullptr,
                                /*engine=*/nullptr,
                                /*key=*/nullptr, iv.data(), /*enc=*/-1));

  if (is_aead && !encrypt) {
    ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_SET_TAG,
                                    tag.size(),
                                    const_cast<uint8_t *>(tag.data())));
  }

  // Note: the deprecated |EVP_CIPHER|-based AEAD API is sensitive to whether
  // parameters are NULL, so it is important to skip the |in| and |aad|
  // |EVP_CipherUpdate| calls when empty.
  while (!aad.empty()) {
    size_t todo =
        chunk_size == 0 ? aad.size() : std::min(aad.size(), chunk_size);
    if (use_evp_cipher) {
      // AEADs always use the "custom cipher" return value convention. Passing a
      // null output pointer triggers the AAD logic.
      ASSERT_TRUE(is_custom_cipher);
      ASSERT_EQ(static_cast<int>(todo),
                EVP_Cipher(ctx.get(), nullptr, aad.data(), todo));
    } else {
      int len;
      ASSERT_TRUE(EVP_CipherUpdate(ctx.get(), nullptr, &len, aad.data(), todo));
      // Although it doesn't output anything, |EVP_CipherUpdate| should claim to
      // output the input length.
      EXPECT_EQ(len, static_cast<int>(todo));
    }
    aad = aad.subspan(todo);
  }

  // Set up the output buffer.
  size_t max_out = in.size();
  size_t block_size = EVP_CIPHER_CTX_block_size(ctx.get());
  if (block_size > 1 &&
      (EVP_CIPHER_CTX_flags(ctx.get()) & EVP_CIPH_NO_PADDING) == 0 &&
      EVP_CIPHER_CTX_encrypting(ctx.get())) {
    max_out += block_size - (max_out % block_size);
  }
  std::vector<uint8_t> result(max_out);
  if (in_place) {
    std::copy(in.begin(), in.end(), result.begin());
    in = bssl::Span(result).first(in.size());
  }

  size_t total = 0;
  int len;
  while (!in.empty()) {
    size_t todo = chunk_size == 0 ? in.size() : std::min(in.size(), chunk_size);
    EXPECT_LE(todo, static_cast<size_t>(INT_MAX));
    ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
    if (use_evp_cipher) {
      // |EVP_Cipher| sometimes returns the number of bytes written, or -1 on
      // error, and sometimes 1 or 0, implicitly writing |in_len| bytes.
      if (is_custom_cipher) {
        len = EVP_Cipher(ctx.get(), result.data() + total, in.data(), todo);
      } else {
        ASSERT_EQ(
            1, EVP_Cipher(ctx.get(), result.data() + total, in.data(), todo));
        len = static_cast<int>(todo);
      }
    } else {
      ASSERT_TRUE(EVP_CipherUpdate(ctx.get(), result.data() + total, &len,
                                   in.data(), static_cast<int>(todo)));
    }
    ASSERT_GE(len, 0);
    total += static_cast<size_t>(len);
    in = in.subspan(todo);
  }
  if (op == Operation::kInvalidDecrypt) {
    if (use_evp_cipher) {
      // Only the "custom cipher" return value convention can report failures.
      // Passing all nulls should act like |EVP_CipherFinal_ex|.
      ASSERT_TRUE(is_custom_cipher);
      EXPECT_EQ(-1, EVP_Cipher(ctx.get(), nullptr, nullptr, 0));
    } else {
      // Invalid padding and invalid tags all appear as a failed
      // |EVP_CipherFinal_ex|.
      EXPECT_FALSE(EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len));
    }
  } else {
    if (use_evp_cipher) {
      if (is_custom_cipher) {
        // Only the "custom cipher" convention has an |EVP_CipherFinal_ex|
        // equivalent.
        len = EVP_Cipher(ctx.get(), nullptr, nullptr, 0);
      } else {
        len = 0;
      }
    } else {
      ASSERT_TRUE(EVP_CipherFinal_ex(ctx.get(), result.data() + total, &len));
    }
    ASSERT_GE(len, 0);
    total += static_cast<size_t>(len);
    result.resize(total);
    EXPECT_EQ(Bytes(expected), Bytes(result));
    if (encrypt && is_aead) {
      uint8_t rtag[16];
      ASSERT_LE(tag.size(), sizeof(rtag));
      ASSERT_TRUE(MaybeCopyCipherContext(copy, &ctx));
      ASSERT_TRUE(EVP_CIPHER_CTX_ctrl(ctx.get(), EVP_CTRL_AEAD_GET_TAG,
                                      tag.size(), rtag));
      EXPECT_EQ(Bytes(tag), Bytes(rtag, tag.size()));
    }
  }
}